

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGeneratorObjectStrings::~cmMakefileTargetGeneratorObjectStrings
          (cmMakefileTargetGeneratorObjectStrings *this)

{
  cmMakefileTargetGeneratorObjectStrings *this_local;
  
  std::__cxx11::string::~string((string *)&this->NextObject);
  std::__cxx11::string::~string((string *)&this->CurrentString);
  return;
}

Assistant:

cmMakefileTargetGeneratorObjectStrings(std::vector<std::string>& strings,
                                         cmLocalUnixMakefileGenerator3* lg,
                                         std::string::size_type limit):
    Strings(strings), LocalGenerator(lg), LengthLimit(limit)
    {
    this->Space = "";
    }